

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.cpp
# Opt level: O2

void scale_interval(uint *I_start,uint *I_end,int *I_l,int *I_bar_l,int n_int,int scale)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  *I_start = 0;
  *I_end = 0;
  uVar4 = 0;
  uVar3 = (ulong)(uint)n_int;
  if (n_int < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar5 = floor((double)I_bar_l[uVar4 + 1] / (double)scale);
    I_bar_l[uVar4 + 1] = (int)dVar5;
    dVar5 = ceil((double)I_l[uVar4 + 1] / (double)scale);
    I_l[uVar4 + 1] = (int)dVar5;
    uVar1 = I_end[uVar4];
    iVar2 = I_bar_l[uVar4 + 1];
    I_start[uVar4 + 1] = uVar1 + iVar2;
    I_end[uVar4 + 1] = uVar1 + iVar2 + I_l[uVar4 + 1];
  }
  return;
}

Assistant:

void scale_interval(unsigned int* I_start, unsigned int* I_end, int* I_l, int* I_bar_l, int n_int, int scale)
{
    I_start[0] = 0;
    I_end[0] = 0;

    for(int i=1; i<=n_int; i++)
    {
        I_bar_l[i] = floor(double(I_bar_l[i]) / scale);
        I_l[i] = ceil(double(I_l[i]) / scale);
        I_start[i] = I_bar_l[i] + I_end[i-1];
        I_end[i] = I_start[i] + I_l[i];
    }
}